

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O0

void __thiscall
iu_RenameParamTest_x_iutest_x_Test_Test::Body(iu_RenameParamTest_x_iutest_x_Test_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  UnitTest *this_00;
  TestInfo *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1;
  char *message;
  type **in_stack_fffffffffffffd68;
  AssertionHelper local_248;
  Fixed local_218;
  string local_90 [32];
  undefined1 local_70 [8];
  AssertionResult iutest_ar;
  allocator<char> local_31;
  string local_30 [8];
  string name;
  iu_RenameParamTest_x_iutest_x_Test_Test *this_local;
  
  name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"Test/",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pPVar2 = iutest::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::operator+=(local_30,(string *)pPVar2);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_90,local_30);
  this_00 = iutest::UnitTest::GetInstance();
  this_01 = iutest::UnitTest::current_test_info(this_00);
  val1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         iutest::TestInfo::name(this_01);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_70,(internal *)0x16670d,
             "::iutest::UnitTest::GetInstance()->current_test_info()->name()",(char *)local_90,val1,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
  std::__cxx11::string::~string(local_90);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    memset(&local_218,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_218);
    message = iutest::AssertionResult::message((AssertionResult *)local_70);
    iutest::AssertionHelper::AssertionHelper
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
               ,0x47,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_248,&local_218);
    iutest::AssertionHelper::~AssertionHelper(&local_248);
    iutest::AssertionHelper::Fixed::~Fixed(&local_218);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

IUTEST_P(RenameParamTest, Test)
{
    ::std::string name = "Test/";
    name += GetParam();
    IUTEST_ASSERT_STREQ(name, ::iutest::UnitTest::GetInstance()->current_test_info()->name());
}